

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_objectwriter.cc
# Opt level: O1

JsonObjectWriter * __thiscall
google::protobuf::util::converter::JsonObjectWriter::RenderBytes
          (JsonObjectWriter *this,StringPiece name,StringPiece value)

{
  size_type *psVar1;
  CodedOutputStream *this_00;
  undefined8 this_01;
  string *this_02;
  string *dest;
  size_t __n;
  uint8 *puVar2;
  StringPiece src;
  StringPiece src_00;
  size_type *local_70;
  string base64;
  char *local_48;
  undefined1 local_40 [16];
  
  this_02 = (string *)value.ptr_;
  dest = this_02;
  WritePrefix(this,name);
  psVar1 = &base64._M_string_length;
  base64._M_dataplus._M_p = (pointer)0x0;
  base64._M_string_length._0_1_ = 0;
  local_70 = psVar1;
  if (this->use_websafe_base64_for_bytes_ == true) {
    base64.field_2._8_8_ = local_40;
    if (this_02 == (string *)0x0) {
      local_48 = (char *)0x0;
      local_40[0] = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&base64.field_2 + 8),this_02,(char *)value.length_ + (long)this_02
                );
    }
    this_01 = base64.field_2._8_8_;
    if ((long)local_48 < 0) {
      StringPiece::LogFatalSizeTooBig((size_t)local_48,"size_t to int conversion");
    }
    src_00.length_ = (stringpiece_ssize_type)&local_70;
    src_00.ptr_ = local_48;
    WebSafeBase64EscapeWithPadding((protobuf *)this_01,src_00,dest);
    if ((undefined1 *)base64.field_2._8_8_ != local_40) {
      operator_delete((void *)base64.field_2._8_8_);
    }
  }
  else {
    src.length_ = (stringpiece_ssize_type)&local_70;
    src.ptr_ = (char *)value.length_;
    Base64Escape((protobuf *)this_02,src,dest);
  }
  WriteChar(this,'\"');
  this_00 = this->stream_;
  puVar2 = this_00->cur_;
  __n = (size_t)(int)base64._M_dataplus._M_p;
  if ((long)(this_00->impl_).end_ - (long)puVar2 < (long)__n) {
    puVar2 = io::EpsCopyOutputStream::WriteRawFallback
                       (&this_00->impl_,local_70,(int)base64._M_dataplus._M_p,puVar2);
  }
  else {
    memcpy(puVar2,local_70,__n);
    puVar2 = puVar2 + __n;
  }
  this_00->cur_ = puVar2;
  WriteChar(this,'\"');
  if (local_70 != psVar1) {
    operator_delete(local_70);
  }
  return this;
}

Assistant:

JsonObjectWriter* JsonObjectWriter::RenderBytes(StringPiece name,
                                                StringPiece value) {
  WritePrefix(name);
  std::string base64;

  if (use_websafe_base64_for_bytes_)
    WebSafeBase64EscapeWithPadding(value.ToString(), &base64);
  else
    Base64Escape(value, &base64);

  WriteChar('"');
  // TODO(wpoon): Consider a ByteSink solution that writes the base64 bytes
  //              directly to the stream, rather than first putting them
  //              into a string and then writing them to the stream.
  stream_->WriteRaw(base64.data(), base64.size());
  WriteChar('"');
  return this;
}